

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Cancel_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Resupply_Cancel_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Resupply_Cancel_PDU *this)

{
  ostream *poVar1;
  ulong uVar2;
  ushort uVar3;
  KStringStream ss;
  char local_399;
  KString local_398;
  long *local_378;
  long local_370;
  long local_368 [2];
  KString local_358;
  stringstream local_338 [16];
  ostream local_328 [112];
  ios_base local_2b8 [264];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_338);
  Header7::GetAsString_abi_cxx11_(&local_358,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_328,local_358._M_dataplus._M_p,local_358._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Resupply Cancel-\n",0x12);
  Logistics_Header::GetAsString_abi_cxx11_(&local_398,&this->super_Logistics_Header);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_399 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_399,1);
  if (local_398._M_string_length != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_399 = local_398._M_dataplus._M_p[uVar2];
      if ((local_398._M_string_length - 1 == uVar2) || (local_399 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_399,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_399,1);
        local_399 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_399,1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < local_398._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_378,local_370);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(local_2b8);
  return __return_storage_ptr__;
}

Assistant:

KString Resupply_Cancel_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Resupply Cancel-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 );

    return ss.str();
}